

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<std::complex<double>_>::MultAdd
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *x,
          TPZFMatrix<std::complex<double>_> *y,TPZFMatrix<std::complex<double>_> *z,
          complex<double> alpha,complex<double> beta,int opt)

{
  complex<double> **ppcVar1;
  complex<double> *__x;
  double col;
  TPZFMatrix<std::complex<double>_> *this_00;
  long lVar2;
  ostream *poVar3;
  complex<double> *pcVar4;
  complex<double> *pcVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int64_t iVar9;
  complex<double> *__y;
  int iVar10;
  ulong uVar11;
  int opt_00;
  double dVar12;
  complex<double> *pcVar13;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double dVar14;
  double dVar15;
  double in_XMM3_Qa;
  complex<double> beta_00;
  double local_e8;
  double dStack_e0;
  double local_d0;
  double local_c8;
  undefined1 local_c0 [16];
  TPZSkylMatrix<std::complex<double>_> *local_b0;
  TPZFMatrix<std::complex<double>_> *local_a8;
  complex<double> local_a0;
  double local_90;
  TPZFMatrix<std::complex<double>_> *local_88;
  double local_80;
  long local_78;
  long local_70;
  undefined1 local_68 [16];
  double local_58;
  double dStack_50;
  double local_48;
  
  opt_00 = alpha._M_value._8_4_;
  uVar11 = alpha._M_value._0_8_;
  iVar10 = alpha._M_value._0_4_;
  uVar8 = uVar11 & 0xffffffff;
  local_c8 = in_XMM3_Qa;
  if (iVar10 == 0) {
    iVar9 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
    if (iVar9 == (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)
    goto LAB_00d4ebce;
LAB_00d4ebd5:
    TPZMatrix<std::complex<double>_>::Error
              ("virtual void TPZSkylMatrix<std::complex<double>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<double>]"
               ," <matrixs with incompatible dimensions>");
    iVar9 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  }
  else {
    iVar9 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
LAB_00d4ebce:
    if ((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow != iVar9)
    goto LAB_00d4ebd5;
  }
  if ((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow == iVar9) {
    lVar2 = (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
    lVar7 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
    lVar6 = lVar2;
    if (lVar2 == lVar7) goto LAB_00d4ec19;
  }
  else {
    lVar7 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  }
  (*(z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xe])(z,iVar9,lVar7);
  lVar2 = (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  lVar6 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
LAB_00d4ec19:
  if ((((lVar6 != (y->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) ||
       (lVar6 != lVar2)) ||
      (lVar7 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow,
      lVar7 != (y->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) ||
     (lVar7 != (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) {
    poVar3 = std::operator<<((ostream *)&std::cout,"x.Cols = ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," y.Cols()");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," z.Cols() ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," x.Rows() ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," y.Rows() ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," z.Rows() ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    TPZMatrix<std::complex<double>_>::Error
              ("virtual void TPZSkylMatrix<std::complex<double>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<double>]"
               ," incompatible dimensions\n");
  }
  dVar15 = 0.0;
  beta_00._M_value._8_8_ = uVar11;
  beta_00._M_value._0_8_ = uVar8;
  dVar14 = local_c8;
  local_88 = z;
  TPZMatrix<std::complex<double>_>::PrepareZ
            (&this->super_TPZMatrix<std::complex<double>_>,y,z,beta_00,opt_00);
  local_80 = (double)(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  local_90 = (double)(x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  local_d0 = 0.0;
  if ((long)local_80 < 1) {
    local_80 = local_d0;
  }
  if ((long)local_90 < 1) {
    local_90 = local_d0;
  }
  local_b0 = this;
  local_a8 = x;
  for (; local_d0 != local_90; local_d0 = (double)((long)local_d0 + 1)) {
    dVar12 = 0.0;
    while (dVar12 != local_80) {
      ppcVar1 = (local_b0->fElem).fStore;
      local_70 = (long)ppcVar1[(long)dVar12 + 1] - (long)ppcVar1[(long)dVar12];
      local_78 = ((long)dVar12 - (local_70 >> 4)) + 1;
      local_e8 = 0.0;
      dStack_e0 = 0.0;
      pcVar4 = x->fElem +
               (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow * (long)local_d0
               + local_78;
      __x = ppcVar1[(long)dVar12];
      lVar7 = local_70;
      while( true ) {
        if ((complex<double> *)(__x[-1]._M_value + lVar7) <= __x) break;
        pcVar5 = (complex<double> *)(__x[-1]._M_value + lVar7);
        if (iVar10 == 0) {
          local_c0._0_8_ = *(undefined8 *)(__x[-1]._M_value + lVar7);
          dVar15 = -0.0;
          dVar14 = -*(double *)(__x[-1]._M_value + lVar7 + 8);
          pcVar5 = (complex<double> *)local_c0;
          local_c0._8_8_ = dVar14;
        }
        std::operator*(pcVar5,pcVar4);
        local_e8 = extraout_XMM0_Qa + local_e8;
        dStack_e0 = dVar14 + dStack_e0;
        pcVar4 = pcVar4 + 1;
        lVar7 = lVar7 + -0x10;
      }
      if (lVar7 + -0x10 == 0) {
        std::operator*(__x,pcVar4);
        local_e8 = extraout_XMM0_Qa_00 + local_e8;
        dStack_e0 = dVar14 + dStack_e0;
      }
      std::operator*((complex<double> *)&local_e8,&local_a0);
      this_00 = local_88;
      col = local_d0;
      local_c8 = dVar12;
      local_58 = dVar14;
      dStack_50 = dVar15;
      local_48 = extraout_XMM0_Qa_01;
      pcVar4 = TPZFMatrix<std::complex<double>_>::operator()
                         (local_88,(int64_t)dVar12,(int64_t)local_d0);
      dVar14 = local_48 + *(double *)pcVar4->_M_value;
      dVar15 = local_58 + *(double *)(pcVar4->_M_value + 8);
      *(double *)pcVar4->_M_value = dVar14;
      *(double *)(pcVar4->_M_value + 8) = dVar15;
      pcVar5 = TPZFMatrix<std::complex<double>_>::operator()(this_00,local_78,(int64_t)col);
      dVar12 = local_c8;
      (*(local_a8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x24])(local_a8,local_c8,col);
      pcVar4 = (complex<double> *)((local_b0->fElem).fStore[(long)dVar12]->_M_value + local_70);
      dStack_e0 = dVar14;
      while (pcVar13 = pcVar4 + -1, __x < pcVar13) {
        __y = pcVar13;
        if (iVar10 != 0) {
          local_68._0_8_ = *(undefined8 *)pcVar13->_M_value;
          dVar15 = -0.0;
          dVar14 = -*(double *)(pcVar4[-1]._M_value + 8);
          __y = (complex<double> *)local_68;
          local_68._8_8_ = dVar14;
        }
        std::operator*(&local_a0,__y);
        local_c0._0_8_ = extraout_XMM0_Qa_02;
        local_c0._8_8_ = dVar14;
        std::operator*((complex<double> *)local_c0,(complex<double> *)&local_e8);
        dVar12 = *(double *)(pcVar5->_M_value + 8);
        *(double *)pcVar5->_M_value = extraout_XMM0_Qa_03 + *(double *)pcVar5->_M_value;
        *(double *)(pcVar5->_M_value + 8) = dVar14 + dVar12;
        pcVar5 = pcVar5 + 1;
        pcVar4 = pcVar13;
      }
      x = local_a8;
      dVar12 = (double)((long)local_c8 + 1);
    }
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                                  const TVar alpha,const TVar beta ,const int opt) const {
	// Computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot overlap in memory
	
	if (this->fDecomposed != ENoDecompose) {
        //		DebugStop();
	}
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," <matrixs with incompatible dimensions>" );
	if(z.Rows() != x.Rows() || z.Cols() != x.Cols()) z.Redim(x.Rows(),x.Cols());
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		cout << "x.Cols = " << x.Cols() << " y.Cols()"<< y.Cols() << " z.Cols() " << z.Cols() << " x.Rows() " << x.Rows() << " y.Rows() "<< y.Rows() << " z.Rows() "<< z.Rows() << endl;
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);

	const int64_t rows = this->Rows();
	const int64_t xcols = x.Cols();
	for (auto ic = 0; ic < xcols; ic++) {
		for(auto r = 0 ; r < rows ; r++ ) {
			const int64_t offset = Size(r);
			TVar val = 0.;
			const TVar *p = &x.g((r-offset+1),ic);
			TVar *diag = fElem[r] + offset-1;
			const TVar *diaglast = fElem[r];
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) val += *diag-- * *p;
                    else val += std::conj(*diag--) * *p;
                }else{
                    val += *diag-- * *p;
                }
				p ++;
			}
			if( diag == diaglast ) val += *diag * *p;
			z(r,ic) += val*alpha;
			TVar *zp = &z((r-offset+1),ic);
			val = x.GetVal(r,ic);
			diag = fElem[r] + offset-1;
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) *zp += alpha * std::conj(*diag--) * val;
                    else *zp += alpha * *diag-- * val;
                }else{
                    *zp += alpha * *diag-- * val;
                }
                zp ++;
			}
		}
	}
}